

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beamsplitter.cpp
# Opt level: O0

void beamsplitter_64(void *key,int len,uint seed,void *out)

{
  long *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint64_t *h;
  uint8_t output [32];
  uint32_t *seed32Arr;
  uint64_t *seed64Arr;
  uint8_t *seed8Arr;
  uint8_t seedbuf [8];
  uint64_t *key64Arr;
  uint8_t *key8Arr;
  int Len_7;
  int sindex_7;
  int index_7;
  int Len_6;
  int sindex_6;
  int index_6;
  int Len_5;
  int sindex_5;
  int index_5;
  int Len_4;
  int sindex_4;
  int index_4;
  int Len_3;
  int sindex_3;
  int index_3;
  int Len_2;
  int sindex_2;
  int index_2;
  int Len_1;
  int sindex_1;
  int index_1;
  int Len;
  int sindex;
  int index;
  uint64_t M;
  int iv;
  int B;
  uint64_t M_1;
  int iv_1;
  int B_1;
  uint64_t M_3;
  int iv_3;
  int B_3;
  uint64_t M_6;
  int iv_6;
  int B_6;
  uint64_t M_5;
  int iv_5;
  int B_5;
  uint64_t M_4;
  int iv_4;
  int B_4;
  uint64_t M_2;
  int iv_2;
  int B_2;
  uint64_t M_7;
  int iv_7;
  int B_7;
  uint64_t M_8;
  int iv_8;
  int B_8;
  uint64_t M_10;
  int iv_10;
  int B_10;
  uint64_t M_13;
  int iv_13;
  int B_13;
  uint64_t M_12;
  int iv_12;
  int B_12;
  uint64_t M_11;
  int iv_11;
  int B_11;
  uint64_t M_9;
  int iv_9;
  int B_9;
  uint64_t M_14;
  int iv_14;
  int B_14;
  uint64_t M_15;
  int iv_15;
  int B_15;
  uint64_t M_17;
  int iv_17;
  int B_17;
  uint64_t M_20;
  int iv_20;
  int B_20;
  uint64_t M_19;
  int iv_19;
  int B_19;
  uint64_t M_18;
  int iv_18;
  int B_18;
  uint64_t M_16;
  int iv_16;
  int B_16;
  uint64_t M_21;
  int iv_21;
  int B_21;
  uint64_t M_22;
  int iv_22;
  int B_22;
  uint64_t M_24;
  int iv_24;
  int B_24;
  uint64_t M_27;
  int iv_27;
  int B_27;
  uint64_t M_26;
  int iv_26;
  int B_26;
  uint64_t M_25;
  int iv_25;
  int B_25;
  uint64_t M_23;
  int iv_23;
  int B_23;
  uint64_t M_28;
  int iv_28;
  int B_28;
  uint64_t M_29;
  int iv_29;
  int B_29;
  uint64_t M_31;
  int iv_31;
  int B_31;
  uint64_t M_34;
  int iv_34;
  int B_34;
  uint64_t M_33;
  int iv_33;
  int B_33;
  uint64_t M_32;
  int iv_32;
  int B_32;
  uint64_t M_30;
  int iv_30;
  int B_30;
  uint64_t M_35;
  int iv_35;
  int B_35;
  uint64_t M_36;
  int iv_36;
  int B_36;
  uint64_t M_38;
  int iv_38;
  int B_38;
  uint64_t M_41;
  int iv_41;
  int B_41;
  uint64_t M_40;
  int iv_40;
  int B_40;
  uint64_t M_39;
  int iv_39;
  int B_39;
  uint64_t M_37;
  int iv_37;
  int B_37;
  uint64_t M_42;
  int iv_42;
  int B_42;
  uint64_t M_43;
  int iv_43;
  int B_43;
  uint64_t M_45;
  int iv_45;
  int B_45;
  uint64_t M_48;
  int iv_48;
  int B_48;
  uint64_t M_47;
  int iv_47;
  int B_47;
  uint64_t M_46;
  int iv_46;
  int B_46;
  uint64_t M_44;
  int iv_44;
  int B_44;
  uint64_t M_49;
  int iv_49;
  int B_49;
  uint64_t M_50;
  int iv_50;
  int B_50;
  uint64_t M_52;
  int iv_52;
  int B_52;
  uint64_t M_55;
  int iv_55;
  int B_55;
  uint64_t M_54;
  int iv_54;
  int B_54;
  uint64_t M_53;
  int iv_53;
  int B_53;
  uint64_t M_51;
  int iv_51;
  int B_51;
  undefined1 local_928 [32];
  undefined8 *local_908;
  undefined8 *local_900;
  undefined8 *local_8f8;
  undefined8 local_8f0;
  long local_8e8;
  long local_8e0;
  long *local_8d8;
  int local_8d0;
  int local_8cc;
  int local_8c0;
  uint local_8bc;
  uint local_8b8;
  int local_8b4;
  long local_8b0;
  long local_8a8;
  int local_8a0;
  uint local_89c;
  uint local_898;
  int local_894;
  long local_890;
  long local_888;
  int local_880;
  uint local_87c;
  uint local_878;
  int local_874;
  long local_870;
  long local_868;
  undefined4 local_860;
  uint local_85c;
  uint local_858;
  undefined4 local_854;
  undefined8 *local_850;
  undefined8 *local_848;
  undefined4 local_840;
  uint local_83c;
  uint local_838;
  undefined4 local_834;
  undefined8 *local_830;
  undefined8 *local_828;
  int local_820;
  uint local_81c;
  uint local_818;
  int local_814;
  long local_810;
  long local_808;
  int local_800;
  uint local_7fc;
  uint local_7f8;
  int local_7f4;
  long local_7f0;
  long local_7e8;
  int local_7e0;
  uint local_7dc;
  uint local_7d8;
  int local_7d4;
  long local_7d0;
  long local_7c8;
  uint local_7bc;
  ulong local_7b8;
  uint local_7ac;
  ulong local_7a8;
  uint local_79c;
  ulong local_798;
  uint local_78c;
  ulong local_788;
  uint local_77c;
  ulong local_778;
  uint local_76c;
  ulong local_768;
  uint local_75c;
  ulong local_758;
  uint local_74c;
  ulong local_748;
  uint64_t local_740;
  uint local_738;
  undefined4 local_734;
  undefined4 local_730;
  uint local_72c;
  ulong local_728;
  uint64_t local_720;
  uint local_718;
  undefined4 local_714;
  undefined4 local_710;
  uint local_70c;
  ulong local_708;
  uint64_t local_700;
  uint local_6f8;
  int local_6f4;
  int local_6f0;
  uint local_6ec;
  ulong local_6e8;
  uint64_t local_6e0;
  uint local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  uint local_6cc;
  ulong local_6c8;
  uint64_t local_6c0;
  uint local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  uint local_6ac;
  ulong local_6a8;
  uint64_t local_6a0;
  uint local_698;
  undefined4 local_694;
  undefined4 local_690;
  uint local_68c;
  ulong local_688;
  uint64_t local_680;
  uint local_678;
  undefined4 local_674;
  undefined4 local_670;
  uint local_66c;
  ulong local_668;
  uint64_t local_660;
  uint local_658;
  undefined4 local_654;
  undefined4 local_650;
  uint local_64c;
  ulong local_648;
  uint64_t local_640;
  uint local_638;
  undefined4 local_634;
  undefined4 local_630;
  uint local_62c;
  ulong local_628;
  uint64_t local_620;
  uint local_618;
  int local_614;
  int local_610;
  uint local_60c;
  ulong local_608;
  uint64_t local_600;
  uint local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  uint local_5ec;
  ulong local_5e8;
  uint64_t local_5e0;
  uint local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  uint local_5cc;
  ulong local_5c8;
  uint64_t local_5c0;
  uint local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  uint local_5ac;
  ulong local_5a8;
  uint64_t local_5a0;
  uint local_598;
  undefined4 local_594;
  undefined4 local_590;
  uint local_58c;
  ulong local_588;
  uint64_t local_580;
  uint local_578;
  undefined4 local_574;
  undefined4 local_570;
  uint local_56c;
  ulong local_568;
  uint64_t local_560;
  uint local_558;
  undefined4 local_554;
  undefined4 local_550;
  uint local_54c;
  ulong local_548;
  uint64_t local_540;
  uint local_538;
  int local_534;
  int local_530;
  uint local_52c;
  ulong local_528;
  uint64_t local_520;
  uint local_518;
  undefined4 local_514;
  undefined4 local_510;
  uint local_50c;
  ulong local_508;
  uint64_t local_500;
  uint local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  uint local_4ec;
  ulong local_4e8;
  uint64_t local_4e0;
  uint local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  uint local_4cc;
  ulong local_4c8;
  uint64_t local_4c0;
  uint local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  uint local_4ac;
  ulong local_4a8;
  uint64_t local_4a0;
  uint local_498;
  undefined4 local_494;
  undefined4 local_490;
  uint local_48c;
  ulong local_488;
  uint64_t local_480;
  uint local_478;
  undefined4 local_474;
  undefined4 local_470;
  uint local_46c;
  ulong local_468;
  uint64_t local_460;
  uint local_458;
  int local_454;
  int local_450;
  uint local_44c;
  ulong local_448;
  uint64_t local_440;
  uint local_438;
  undefined4 local_434;
  undefined4 local_430;
  uint local_42c;
  ulong local_428;
  uint64_t local_420;
  uint local_418;
  undefined4 local_414;
  undefined4 local_410;
  uint local_40c;
  ulong local_408;
  uint64_t local_400;
  uint local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  uint local_3ec;
  ulong local_3e8;
  uint64_t local_3e0;
  uint local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  uint local_3cc;
  ulong local_3c8;
  uint64_t local_3c0;
  uint local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  uint local_3ac;
  ulong local_3a8;
  uint64_t local_3a0;
  uint local_398;
  undefined4 local_394;
  undefined4 local_390;
  uint local_38c;
  ulong local_388;
  uint64_t local_380;
  uint local_378;
  int local_374;
  int local_370;
  uint local_36c;
  ulong local_368;
  uint64_t local_360;
  uint local_358;
  undefined4 local_354;
  undefined4 local_350;
  uint local_34c;
  ulong local_348;
  uint64_t local_340;
  uint local_338;
  undefined4 local_334;
  undefined4 local_330;
  uint local_32c;
  ulong local_328;
  uint64_t local_320;
  uint local_318;
  undefined4 local_314;
  undefined4 local_310;
  uint local_30c;
  ulong local_308;
  uint64_t local_300;
  uint local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  uint local_2ec;
  ulong local_2e8;
  uint64_t local_2e0;
  uint local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  uint local_2cc;
  ulong local_2c8;
  uint64_t local_2c0;
  uint local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  uint local_2ac;
  ulong local_2a8;
  uint64_t local_2a0;
  uint local_298;
  int local_294;
  int local_290;
  uint local_28c;
  ulong local_288;
  uint64_t local_280;
  uint local_278;
  undefined4 local_274;
  undefined4 local_270;
  uint local_26c;
  ulong local_268;
  uint64_t local_260;
  uint local_258;
  undefined4 local_254;
  undefined4 local_250;
  uint local_24c;
  ulong local_248;
  uint64_t local_240;
  uint local_238;
  undefined4 local_234;
  undefined4 local_230;
  uint local_22c;
  ulong local_228;
  uint64_t local_220;
  uint local_218;
  undefined4 local_214;
  undefined4 local_210;
  uint local_20c;
  ulong local_208;
  uint64_t local_200;
  uint local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  uint local_1ec;
  ulong local_1e8;
  uint64_t local_1e0;
  uint local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  uint local_1cc;
  ulong local_1c8;
  uint64_t local_1c0;
  uint local_1b8;
  int local_1b4;
  int local_1b0;
  uint local_1ac;
  ulong local_1a8;
  uint64_t local_1a0;
  uint local_198;
  undefined4 local_194;
  undefined4 local_190;
  uint local_18c;
  ulong local_188;
  uint64_t local_180;
  uint local_178;
  undefined4 local_174;
  undefined4 local_170;
  uint local_16c;
  ulong local_168;
  uint64_t local_160;
  uint local_158;
  undefined4 local_154;
  undefined4 local_150;
  uint local_14c;
  ulong local_148;
  uint64_t local_140;
  uint local_138;
  undefined4 local_134;
  undefined4 local_130;
  uint local_12c;
  ulong local_128;
  uint64_t local_120;
  uint local_118;
  undefined4 local_114;
  undefined4 local_110;
  uint local_10c;
  ulong local_108;
  uint64_t local_100;
  uint local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  uint local_ec;
  ulong local_e8;
  uint64_t local_e0;
  uint local_d8;
  int local_d4;
  int local_d0;
  uint local_cc;
  ulong local_c8;
  uint64_t local_c0;
  uint local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  uint local_ac;
  ulong local_a8;
  uint64_t local_a0;
  uint local_98;
  undefined4 local_94;
  undefined4 local_90;
  uint local_8c;
  ulong local_88;
  uint64_t local_80;
  uint local_78;
  undefined4 local_74;
  undefined4 local_70;
  uint local_6c;
  ulong local_68;
  uint64_t local_60;
  uint local_58;
  undefined4 local_54;
  undefined4 local_50;
  uint local_4c;
  ulong local_48;
  uint local_40;
  byte local_39;
  uint local_38;
  byte local_31;
  uint local_30;
  byte local_29;
  uint local_28;
  byte local_21;
  uint local_20;
  byte local_19;
  uint local_18;
  byte local_11;
  uint local_10;
  byte local_9;
  uint local_8;
  byte local_1;
  
  local_8e8 = in_RDI;
  local_8e0 = in_RDI;
  local_8d8 = in_RCX;
  local_8d0 = in_EDX;
  local_8cc = in_ESI;
  memset(&local_8f0,0,8);
  local_8f8 = &local_8f0;
  local_900 = &local_8f0;
  local_908 = &local_8f0;
  local_8f0._0_4_ = 0xc5550690;
  local_8f0._0_4_ = -0x3aaaf970 - local_8d0;
  local_8f0._4_4_ = 1U - local_8d0 ^ 0xffffffff;
  *state = 0x123456789abcdef0;
  state[1] = 0xfedcba987654321;
  state[2] = 0xaccadacca80081e5;
  state[3] = 0xf00baaf00f00baaa;
  local_7c8 = local_8e8;
  local_7d0 = local_8e0;
  local_7d4 = local_8cc;
  local_7dc = 0;
  local_8c0 = local_8cc >> 3;
  for (local_7d8 = 0; (int)local_7d8 < local_8c0; local_7d8 = local_7d8 + 1) {
    local_7b8 = *(long *)(local_8e8 + (long)(int)local_7d8 * 8) + (long)(int)local_7d8 + 1;
    local_7bc = (int)state[(int)local_7dc] + local_7d8 + 1 & 0x3f;
    if (local_7bc != 0) {
      local_7b8 = local_7b8 >> (sbyte)local_7bc | local_7b8 << (0x40U - (sbyte)local_7bc & 0x3f);
    }
    state[(int)local_7dc] = local_7b8 + state[(int)local_7dc];
    if (local_7dc == 1) {
      local_730 = 0;
      local_734 = 1;
      local_738 = (uint)*state & 0x3ff;
      local_740 = T[(int)local_738];
      state[1] = local_740 + *state + state[1];
      *state = state[1] ^ *state;
      state[1] = *state ^ state[1];
      *state = state[1] ^ *state;
      local_728 = state[1];
      local_72c = (uint)*state & 0x3f;
      if ((*state & 0x3f) != 0) {
        local_728 = local_728 >> (sbyte)local_72c | local_728 << (0x40U - (sbyte)local_72c & 0x3f);
      }
      state[1] = local_728;
    }
    else if (local_7dc == 3) {
      local_710 = 2;
      local_714 = 3;
      local_718 = (uint)state[2] & 0x3ff;
      local_720 = T[(int)local_718];
      state[3] = local_720 + state[2] + state[3];
      state[2] = state[3] ^ state[2];
      state[3] = state[2] ^ state[3];
      state[2] = state[3] ^ state[2];
      local_708 = state[3];
      local_70c = (uint)state[2] & 0x3f;
      if ((state[2] & 0x3f) != 0) {
        local_708 = local_708 >> (sbyte)local_70c | local_708 << (0x40U - (sbyte)local_70c & 0x3f);
      }
      state[3] = local_708;
      local_7dc = -1;
    }
    local_7dc = local_7dc + 1;
  }
  local_670 = 0;
  local_674 = 1;
  local_678 = (uint)*state & 0x3ff;
  local_680 = T[(int)local_678];
  state[1] = local_680 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_668 = state[1];
  local_66c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_668 = local_668 >> (sbyte)local_66c | local_668 << (0x40U - (sbyte)local_66c & 0x3f);
  }
  state[1] = local_668;
  local_7d8 = local_7d8 << 3;
  local_7dc = local_7d8 & 0x1f;
  for (; (int)local_7d8 < local_8cc; local_7d8 = local_7d8 + 1) {
    local_39 = *(char *)(local_8e0 + (int)local_7d8) + (char)local_7d8 + 1;
    local_40 = state8[(int)local_7dc] + local_7d8 + 1 & 7;
    if (local_40 != 0) {
      local_39 = (byte)((int)(uint)local_39 >> (sbyte)local_40) |
                 local_39 << (8U - (sbyte)local_40 & 0x1f);
    }
    state8[(int)local_7dc] = state8[(int)local_7dc] + local_39;
    local_6f0 = (int)local_7d8 % 3;
    local_6f4 = local_6f0 + 1;
    local_6f8 = (uint)state[local_6f0] & 0x3ff;
    local_700 = T[(int)local_6f8];
    state[local_6f4] = local_700 + state[local_6f0] + state[local_6f4];
    state[local_6f0] = state[local_6f4] ^ state[local_6f0];
    state[local_6f4] = state[local_6f0] ^ state[local_6f4];
    state[local_6f0] = state[local_6f4] ^ state[local_6f0];
    local_6e8 = state[local_6f4];
    local_6ec = (uint)state[local_6f0] & 0x3f;
    if ((state[local_6f0] & 0x3f) != 0) {
      local_6e8 = local_6e8 >> (sbyte)local_6ec | local_6e8 << (0x40U - (sbyte)local_6ec & 0x3f);
    }
    state[local_6f4] = local_6e8;
    if (0x1e < (int)local_7dc) {
      local_7dc = 0xffffffff;
    }
    local_7dc = local_7dc + 1;
  }
  local_690 = 0;
  local_694 = 1;
  local_698 = (uint)*state & 0x3ff;
  local_6a0 = T[(int)local_698];
  state[1] = local_6a0 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_688 = state[1];
  local_68c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_688 = local_688 >> (sbyte)local_68c | local_688 << (0x40U - (sbyte)local_68c & 0x3f);
  }
  state[1] = local_688;
  local_6b0 = 1;
  local_6b4 = 2;
  local_6b8 = (uint)state[1] & 0x3ff;
  local_6c0 = T[(int)local_6b8];
  state[2] = local_6c0 + state[1] + state[2];
  state[1] = state[2] ^ state[1];
  state[2] = state[1] ^ state[2];
  state[1] = state[2] ^ state[1];
  local_6a8 = state[2];
  local_6ac = (uint)state[1] & 0x3f;
  if ((state[1] & 0x3f) != 0) {
    local_6a8 = local_6a8 >> (sbyte)local_6ac | local_6a8 << (0x40U - (sbyte)local_6ac & 0x3f);
  }
  state[2] = local_6a8;
  local_6d0 = 2;
  local_6d4 = 3;
  local_6d8 = (uint)state[2] & 0x3ff;
  local_6e0 = T[(int)local_6d8];
  state[3] = local_6e0 + state[2] + state[3];
  state[2] = state[3] ^ state[2];
  state[3] = state[2] ^ state[3];
  state[2] = state[3] ^ state[2];
  local_6c8 = state[3];
  local_6cc = (uint)state[2] & 0x3f;
  if ((state[2] & 0x3f) != 0) {
    local_6c8 = local_6c8 >> (sbyte)local_6cc | local_6c8 << (0x40U - (sbyte)local_6cc & 0x3f);
  }
  state[3] = local_6c8;
  local_7e8 = local_8e8;
  local_7f0 = local_8e0;
  local_7f4 = local_8cc;
  local_7fc = 0;
  for (local_7f8 = 0; (int)local_7f8 < local_8c0; local_7f8 = local_7f8 + 1) {
    local_7a8 = *(long *)(local_8e8 + (long)(int)local_7f8 * 8) + (long)(int)local_7f8 + 1;
    local_7ac = (int)state[(int)local_7fc] + local_7f8 + 1 & 0x3f;
    if (local_7ac != 0) {
      local_7a8 = local_7a8 >> (sbyte)local_7ac | local_7a8 << (0x40U - (sbyte)local_7ac & 0x3f);
    }
    state[(int)local_7fc] = local_7a8 + state[(int)local_7fc];
    if (local_7fc == 1) {
      local_650 = 0;
      local_654 = 1;
      local_658 = (uint)*state & 0x3ff;
      local_660 = T[(int)local_658];
      state[1] = local_660 + *state + state[1];
      *state = state[1] ^ *state;
      state[1] = *state ^ state[1];
      *state = state[1] ^ *state;
      local_648 = state[1];
      local_64c = (uint)*state & 0x3f;
      if ((*state & 0x3f) != 0) {
        local_648 = local_648 >> (sbyte)local_64c | local_648 << (0x40U - (sbyte)local_64c & 0x3f);
      }
      state[1] = local_648;
    }
    else if (local_7fc == 3) {
      local_630 = 2;
      local_634 = 3;
      local_638 = (uint)state[2] & 0x3ff;
      local_640 = T[(int)local_638];
      state[3] = local_640 + state[2] + state[3];
      state[2] = state[3] ^ state[2];
      state[3] = state[2] ^ state[3];
      state[2] = state[3] ^ state[2];
      local_628 = state[3];
      local_62c = (uint)state[2] & 0x3f;
      if ((state[2] & 0x3f) != 0) {
        local_628 = local_628 >> (sbyte)local_62c | local_628 << (0x40U - (sbyte)local_62c & 0x3f);
      }
      state[3] = local_628;
      local_7fc = -1;
    }
    local_7fc = local_7fc + 1;
  }
  local_590 = 0;
  local_594 = 1;
  local_598 = (uint)*state & 0x3ff;
  local_5a0 = T[(int)local_598];
  state[1] = local_5a0 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_588 = state[1];
  local_58c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_588 = local_588 >> (sbyte)local_58c | local_588 << (0x40U - (sbyte)local_58c & 0x3f);
  }
  state[1] = local_588;
  local_7f8 = local_7f8 << 3;
  local_7fc = local_7f8 & 0x1f;
  for (; (int)local_7f8 < local_8cc; local_7f8 = local_7f8 + 1) {
    local_31 = *(char *)(local_8e0 + (int)local_7f8) + (char)local_7f8 + 1;
    local_38 = state8[(int)local_7fc] + local_7f8 + 1 & 7;
    if (local_38 != 0) {
      local_31 = (byte)((int)(uint)local_31 >> (sbyte)local_38) |
                 local_31 << (8U - (sbyte)local_38 & 0x1f);
    }
    state8[(int)local_7fc] = state8[(int)local_7fc] + local_31;
    local_610 = (int)local_7f8 % 3;
    local_614 = local_610 + 1;
    local_618 = (uint)state[local_610] & 0x3ff;
    local_620 = T[(int)local_618];
    state[local_614] = local_620 + state[local_610] + state[local_614];
    state[local_610] = state[local_614] ^ state[local_610];
    state[local_614] = state[local_610] ^ state[local_614];
    state[local_610] = state[local_614] ^ state[local_610];
    local_608 = state[local_614];
    local_60c = (uint)state[local_610] & 0x3f;
    if ((state[local_610] & 0x3f) != 0) {
      local_608 = local_608 >> (sbyte)local_60c | local_608 << (0x40U - (sbyte)local_60c & 0x3f);
    }
    state[local_614] = local_608;
    if (0x1e < (int)local_7fc) {
      local_7fc = 0xffffffff;
    }
    local_7fc = local_7fc + 1;
  }
  local_5b0 = 0;
  local_5b4 = 1;
  local_5b8 = (uint)*state & 0x3ff;
  local_5c0 = T[(int)local_5b8];
  state[1] = local_5c0 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_5a8 = state[1];
  local_5ac = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_5a8 = local_5a8 >> (sbyte)local_5ac | local_5a8 << (0x40U - (sbyte)local_5ac & 0x3f);
  }
  state[1] = local_5a8;
  local_5d0 = 1;
  local_5d4 = 2;
  local_5d8 = (uint)state[1] & 0x3ff;
  local_5e0 = T[(int)local_5d8];
  state[2] = local_5e0 + state[1] + state[2];
  state[1] = state[2] ^ state[1];
  state[2] = state[1] ^ state[2];
  state[1] = state[2] ^ state[1];
  local_5c8 = state[2];
  local_5cc = (uint)state[1] & 0x3f;
  if ((state[1] & 0x3f) != 0) {
    local_5c8 = local_5c8 >> (sbyte)local_5cc | local_5c8 << (0x40U - (sbyte)local_5cc & 0x3f);
  }
  state[2] = local_5c8;
  local_5f0 = 2;
  local_5f4 = 3;
  local_5f8 = (uint)state[2] & 0x3ff;
  local_600 = T[(int)local_5f8];
  state[3] = local_600 + state[2] + state[3];
  state[2] = state[3] ^ state[2];
  state[3] = state[2] ^ state[3];
  state[2] = state[3] ^ state[2];
  local_5e8 = state[3];
  local_5ec = (uint)state[2] & 0x3f;
  if ((state[2] & 0x3f) != 0) {
    local_5e8 = local_5e8 >> (sbyte)local_5ec | local_5e8 << (0x40U - (sbyte)local_5ec & 0x3f);
  }
  state[3] = local_5e8;
  local_808 = local_8e8;
  local_810 = local_8e0;
  local_814 = local_8cc;
  local_81c = 0;
  for (local_818 = 0; (int)local_818 < local_8c0; local_818 = local_818 + 1) {
    local_798 = *(long *)(local_8e8 + (long)(int)local_818 * 8) + (long)(int)local_818 + 1;
    local_79c = (int)state[(int)local_81c] + local_818 + 1 & 0x3f;
    if (local_79c != 0) {
      local_798 = local_798 >> (sbyte)local_79c | local_798 << (0x40U - (sbyte)local_79c & 0x3f);
    }
    state[(int)local_81c] = local_798 + state[(int)local_81c];
    if (local_81c == 1) {
      local_570 = 0;
      local_574 = 1;
      local_578 = (uint)*state & 0x3ff;
      local_580 = T[(int)local_578];
      state[1] = local_580 + *state + state[1];
      *state = state[1] ^ *state;
      state[1] = *state ^ state[1];
      *state = state[1] ^ *state;
      local_568 = state[1];
      local_56c = (uint)*state & 0x3f;
      if ((*state & 0x3f) != 0) {
        local_568 = local_568 >> (sbyte)local_56c | local_568 << (0x40U - (sbyte)local_56c & 0x3f);
      }
      state[1] = local_568;
    }
    else if (local_81c == 3) {
      local_550 = 2;
      local_554 = 3;
      local_558 = (uint)state[2] & 0x3ff;
      local_560 = T[(int)local_558];
      state[3] = local_560 + state[2] + state[3];
      state[2] = state[3] ^ state[2];
      state[3] = state[2] ^ state[3];
      state[2] = state[3] ^ state[2];
      local_548 = state[3];
      local_54c = (uint)state[2] & 0x3f;
      if ((state[2] & 0x3f) != 0) {
        local_548 = local_548 >> (sbyte)local_54c | local_548 << (0x40U - (sbyte)local_54c & 0x3f);
      }
      state[3] = local_548;
      local_81c = -1;
    }
    local_81c = local_81c + 1;
  }
  local_4b0 = 0;
  local_4b4 = 1;
  local_4b8 = (uint)*state & 0x3ff;
  local_4c0 = T[(int)local_4b8];
  state[1] = local_4c0 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_4a8 = state[1];
  local_4ac = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_4a8 = local_4a8 >> (sbyte)local_4ac | local_4a8 << (0x40U - (sbyte)local_4ac & 0x3f);
  }
  state[1] = local_4a8;
  local_818 = local_818 << 3;
  local_81c = local_818 & 0x1f;
  for (; (int)local_818 < local_8cc; local_818 = local_818 + 1) {
    local_29 = *(char *)(local_8e0 + (int)local_818) + (char)local_818 + 1;
    local_30 = state8[(int)local_81c] + local_818 + 1 & 7;
    if (local_30 != 0) {
      local_29 = (byte)((int)(uint)local_29 >> (sbyte)local_30) |
                 local_29 << (8U - (sbyte)local_30 & 0x1f);
    }
    state8[(int)local_81c] = state8[(int)local_81c] + local_29;
    local_530 = (int)local_818 % 3;
    local_534 = local_530 + 1;
    local_538 = (uint)state[local_530] & 0x3ff;
    local_540 = T[(int)local_538];
    state[local_534] = local_540 + state[local_530] + state[local_534];
    state[local_530] = state[local_534] ^ state[local_530];
    state[local_534] = state[local_530] ^ state[local_534];
    state[local_530] = state[local_534] ^ state[local_530];
    local_528 = state[local_534];
    local_52c = (uint)state[local_530] & 0x3f;
    if ((state[local_530] & 0x3f) != 0) {
      local_528 = local_528 >> (sbyte)local_52c | local_528 << (0x40U - (sbyte)local_52c & 0x3f);
    }
    state[local_534] = local_528;
    if (0x1e < (int)local_81c) {
      local_81c = 0xffffffff;
    }
    local_81c = local_81c + 1;
  }
  local_4d0 = 0;
  local_4d4 = 1;
  local_4d8 = (uint)*state & 0x3ff;
  local_4e0 = T[(int)local_4d8];
  state[1] = local_4e0 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_4c8 = state[1];
  local_4cc = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_4c8 = local_4c8 >> (sbyte)local_4cc | local_4c8 << (0x40U - (sbyte)local_4cc & 0x3f);
  }
  state[1] = local_4c8;
  local_4f0 = 1;
  local_4f4 = 2;
  local_4f8 = (uint)state[1] & 0x3ff;
  local_500 = T[(int)local_4f8];
  state[2] = local_500 + state[1] + state[2];
  state[1] = state[2] ^ state[1];
  state[2] = state[1] ^ state[2];
  state[1] = state[2] ^ state[1];
  local_4e8 = state[2];
  local_4ec = (uint)state[1] & 0x3f;
  if ((state[1] & 0x3f) != 0) {
    local_4e8 = local_4e8 >> (sbyte)local_4ec | local_4e8 << (0x40U - (sbyte)local_4ec & 0x3f);
  }
  state[2] = local_4e8;
  local_510 = 2;
  local_514 = 3;
  local_518 = (uint)state[2] & 0x3ff;
  local_520 = T[(int)local_518];
  state[3] = local_520 + state[2] + state[3];
  state[2] = state[3] ^ state[2];
  state[3] = state[2] ^ state[3];
  state[2] = state[3] ^ state[2];
  local_508 = state[3];
  local_50c = (uint)state[2] & 0x3f;
  if ((state[2] & 0x3f) != 0) {
    local_508 = local_508 >> (sbyte)local_50c | local_508 << (0x40U - (sbyte)local_50c & 0x3f);
  }
  state[3] = local_508;
  local_834 = 8;
  local_83c = 0;
  local_840 = 1;
  for (local_838 = 0; (int)local_838 < 1; local_838 = local_838 + 1) {
    local_788 = local_900[(int)local_838] + (long)(int)local_838 + 1;
    local_78c = (int)state[(int)local_83c] + local_838 + 1 & 0x3f;
    if (local_78c != 0) {
      local_788 = local_788 >> (sbyte)local_78c | local_788 << (0x40U - (sbyte)local_78c & 0x3f);
    }
    state[(int)local_83c] = local_788 + state[(int)local_83c];
    if (local_83c == 1) {
      local_490 = 0;
      local_494 = 1;
      local_498 = (uint)*state & 0x3ff;
      local_4a0 = T[(int)local_498];
      state[1] = local_4a0 + *state + state[1];
      *state = state[1] ^ *state;
      state[1] = *state ^ state[1];
      *state = state[1] ^ *state;
      local_488 = state[1];
      local_48c = (uint)*state & 0x3f;
      if ((*state & 0x3f) != 0) {
        local_488 = local_488 >> (sbyte)local_48c | local_488 << (0x40U - (sbyte)local_48c & 0x3f);
      }
      state[1] = local_488;
    }
    else if (local_83c == 3) {
      local_470 = 2;
      local_474 = 3;
      local_478 = (uint)state[2] & 0x3ff;
      local_480 = T[(int)local_478];
      state[3] = local_480 + state[2] + state[3];
      state[2] = state[3] ^ state[2];
      state[3] = state[2] ^ state[3];
      state[2] = state[3] ^ state[2];
      local_468 = state[3];
      local_46c = (uint)state[2] & 0x3f;
      if ((state[2] & 0x3f) != 0) {
        local_468 = local_468 >> (sbyte)local_46c | local_468 << (0x40U - (sbyte)local_46c & 0x3f);
      }
      state[3] = local_468;
      local_83c = -1;
    }
    local_83c = local_83c + 1;
  }
  local_3d0 = 0;
  local_3d4 = 1;
  local_3d8 = (uint)*state & 0x3ff;
  local_3e0 = T[(int)local_3d8];
  state[1] = local_3e0 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_3c8 = state[1];
  local_3cc = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_3c8 = local_3c8 >> (sbyte)local_3cc | local_3c8 << (0x40U - (sbyte)local_3cc & 0x3f);
  }
  state[1] = local_3c8;
  local_838 = local_838 << 3;
  local_83c = local_838 & 0x1f;
  for (; (int)local_838 < 8; local_838 = local_838 + 1) {
    local_21 = *(char *)((long)local_8f8 + (long)(int)local_838) + (char)local_838 + 1;
    local_28 = state8[(int)local_83c] + local_838 + 1 & 7;
    if (local_28 != 0) {
      local_21 = (byte)((int)(uint)local_21 >> (sbyte)local_28) |
                 local_21 << (8U - (sbyte)local_28 & 0x1f);
    }
    state8[(int)local_83c] = state8[(int)local_83c] + local_21;
    local_450 = (int)local_838 % 3;
    local_454 = local_450 + 1;
    local_458 = (uint)state[local_450] & 0x3ff;
    local_460 = T[(int)local_458];
    state[local_454] = local_460 + state[local_450] + state[local_454];
    state[local_450] = state[local_454] ^ state[local_450];
    state[local_454] = state[local_450] ^ state[local_454];
    state[local_450] = state[local_454] ^ state[local_450];
    local_448 = state[local_454];
    local_44c = (uint)state[local_450] & 0x3f;
    if ((state[local_450] & 0x3f) != 0) {
      local_448 = local_448 >> (sbyte)local_44c | local_448 << (0x40U - (sbyte)local_44c & 0x3f);
    }
    state[local_454] = local_448;
    if (0x1e < (int)local_83c) {
      local_83c = 0xffffffff;
    }
    local_83c = local_83c + 1;
  }
  local_3f0 = 0;
  local_3f4 = 1;
  local_3f8 = (uint)*state & 0x3ff;
  local_400 = T[(int)local_3f8];
  state[1] = local_400 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_3e8 = state[1];
  local_3ec = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_3e8 = local_3e8 >> (sbyte)local_3ec | local_3e8 << (0x40U - (sbyte)local_3ec & 0x3f);
  }
  state[1] = local_3e8;
  local_410 = 1;
  local_414 = 2;
  local_418 = (uint)state[1] & 0x3ff;
  local_420 = T[(int)local_418];
  state[2] = local_420 + state[1] + state[2];
  state[1] = state[2] ^ state[1];
  state[2] = state[1] ^ state[2];
  state[1] = state[2] ^ state[1];
  local_408 = state[2];
  local_40c = (uint)state[1] & 0x3f;
  if ((state[1] & 0x3f) != 0) {
    local_408 = local_408 >> (sbyte)local_40c | local_408 << (0x40U - (sbyte)local_40c & 0x3f);
  }
  state[2] = local_408;
  local_430 = 2;
  local_434 = 3;
  local_438 = (uint)state[2] & 0x3ff;
  local_440 = T[(int)local_438];
  state[3] = local_440 + state[2] + state[3];
  state[2] = state[3] ^ state[2];
  state[3] = state[2] ^ state[3];
  state[2] = state[3] ^ state[2];
  local_428 = state[3];
  local_42c = (uint)state[2] & 0x3f;
  if ((state[2] & 0x3f) != 0) {
    local_428 = local_428 >> (sbyte)local_42c | local_428 << (0x40U - (sbyte)local_42c & 0x3f);
  }
  state[3] = local_428;
  local_854 = 8;
  local_85c = 0;
  local_860 = 1;
  for (local_858 = 0; (int)local_858 < 1; local_858 = local_858 + 1) {
    local_778 = local_900[(int)local_858] + (long)(int)local_858 + 1;
    local_77c = (int)state[(int)local_85c] + local_858 + 1 & 0x3f;
    if (local_77c != 0) {
      local_778 = local_778 >> (sbyte)local_77c | local_778 << (0x40U - (sbyte)local_77c & 0x3f);
    }
    state[(int)local_85c] = local_778 + state[(int)local_85c];
    if (local_85c == 1) {
      local_3b0 = 0;
      local_3b4 = 1;
      local_3b8 = (uint)*state & 0x3ff;
      local_3c0 = T[(int)local_3b8];
      state[1] = local_3c0 + *state + state[1];
      *state = state[1] ^ *state;
      state[1] = *state ^ state[1];
      *state = state[1] ^ *state;
      local_3a8 = state[1];
      local_3ac = (uint)*state & 0x3f;
      if ((*state & 0x3f) != 0) {
        local_3a8 = local_3a8 >> (sbyte)local_3ac | local_3a8 << (0x40U - (sbyte)local_3ac & 0x3f);
      }
      state[1] = local_3a8;
    }
    else if (local_85c == 3) {
      local_390 = 2;
      local_394 = 3;
      local_398 = (uint)state[2] & 0x3ff;
      local_3a0 = T[(int)local_398];
      state[3] = local_3a0 + state[2] + state[3];
      state[2] = state[3] ^ state[2];
      state[3] = state[2] ^ state[3];
      state[2] = state[3] ^ state[2];
      local_388 = state[3];
      local_38c = (uint)state[2] & 0x3f;
      if ((state[2] & 0x3f) != 0) {
        local_388 = local_388 >> (sbyte)local_38c | local_388 << (0x40U - (sbyte)local_38c & 0x3f);
      }
      state[3] = local_388;
      local_85c = -1;
    }
    local_85c = local_85c + 1;
  }
  local_2f0 = 0;
  local_2f4 = 1;
  local_2f8 = (uint)*state & 0x3ff;
  local_300 = T[(int)local_2f8];
  state[1] = local_300 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_2e8 = state[1];
  local_2ec = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_2e8 = local_2e8 >> (sbyte)local_2ec | local_2e8 << (0x40U - (sbyte)local_2ec & 0x3f);
  }
  state[1] = local_2e8;
  local_858 = local_858 << 3;
  local_85c = local_858 & 0x1f;
  for (; (int)local_858 < 8; local_858 = local_858 + 1) {
    local_19 = *(char *)((long)local_8f8 + (long)(int)local_858) + (char)local_858 + 1;
    local_20 = state8[(int)local_85c] + local_858 + 1 & 7;
    if (local_20 != 0) {
      local_19 = (byte)((int)(uint)local_19 >> (sbyte)local_20) |
                 local_19 << (8U - (sbyte)local_20 & 0x1f);
    }
    state8[(int)local_85c] = state8[(int)local_85c] + local_19;
    local_370 = (int)local_858 % 3;
    local_374 = local_370 + 1;
    local_378 = (uint)state[local_370] & 0x3ff;
    local_380 = T[(int)local_378];
    state[local_374] = local_380 + state[local_370] + state[local_374];
    state[local_370] = state[local_374] ^ state[local_370];
    state[local_374] = state[local_370] ^ state[local_374];
    state[local_370] = state[local_374] ^ state[local_370];
    local_368 = state[local_374];
    local_36c = (uint)state[local_370] & 0x3f;
    if ((state[local_370] & 0x3f) != 0) {
      local_368 = local_368 >> (sbyte)local_36c | local_368 << (0x40U - (sbyte)local_36c & 0x3f);
    }
    state[local_374] = local_368;
    if (0x1e < (int)local_85c) {
      local_85c = 0xffffffff;
    }
    local_85c = local_85c + 1;
  }
  local_310 = 0;
  local_314 = 1;
  local_318 = (uint)*state & 0x3ff;
  local_320 = T[(int)local_318];
  state[1] = local_320 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_308 = state[1];
  local_30c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_308 = local_308 >> (sbyte)local_30c | local_308 << (0x40U - (sbyte)local_30c & 0x3f);
  }
  state[1] = local_308;
  local_330 = 1;
  local_334 = 2;
  local_338 = (uint)state[1] & 0x3ff;
  local_340 = T[(int)local_338];
  state[2] = local_340 + state[1] + state[2];
  state[1] = state[2] ^ state[1];
  state[2] = state[1] ^ state[2];
  state[1] = state[2] ^ state[1];
  local_328 = state[2];
  local_32c = (uint)state[1] & 0x3f;
  if ((state[1] & 0x3f) != 0) {
    local_328 = local_328 >> (sbyte)local_32c | local_328 << (0x40U - (sbyte)local_32c & 0x3f);
  }
  state[2] = local_328;
  local_350 = 2;
  local_354 = 3;
  local_358 = (uint)state[2] & 0x3ff;
  local_360 = T[(int)local_358];
  state[3] = local_360 + state[2] + state[3];
  state[2] = state[3] ^ state[2];
  state[3] = state[2] ^ state[3];
  state[2] = state[3] ^ state[2];
  local_348 = state[3];
  local_34c = (uint)state[2] & 0x3f;
  if ((state[2] & 0x3f) != 0) {
    local_348 = local_348 >> (sbyte)local_34c | local_348 << (0x40U - (sbyte)local_34c & 0x3f);
  }
  state[3] = local_348;
  local_868 = local_8e8;
  local_870 = local_8e0;
  local_874 = local_8cc;
  local_87c = 0;
  for (local_878 = 0; (int)local_878 < local_8c0; local_878 = local_878 + 1) {
    local_768 = *(long *)(local_8e8 + (long)(int)local_878 * 8) + (long)(int)local_878 + 1;
    local_76c = (int)state[(int)local_87c] + local_878 + 1 & 0x3f;
    if (local_76c != 0) {
      local_768 = local_768 >> (sbyte)local_76c | local_768 << (0x40U - (sbyte)local_76c & 0x3f);
    }
    state[(int)local_87c] = local_768 + state[(int)local_87c];
    if (local_87c == 1) {
      local_2d0 = 0;
      local_2d4 = 1;
      local_2d8 = (uint)*state & 0x3ff;
      local_2e0 = T[(int)local_2d8];
      state[1] = local_2e0 + *state + state[1];
      *state = state[1] ^ *state;
      state[1] = *state ^ state[1];
      *state = state[1] ^ *state;
      local_2c8 = state[1];
      local_2cc = (uint)*state & 0x3f;
      if ((*state & 0x3f) != 0) {
        local_2c8 = local_2c8 >> (sbyte)local_2cc | local_2c8 << (0x40U - (sbyte)local_2cc & 0x3f);
      }
      state[1] = local_2c8;
    }
    else if (local_87c == 3) {
      local_2b0 = 2;
      local_2b4 = 3;
      local_2b8 = (uint)state[2] & 0x3ff;
      local_2c0 = T[(int)local_2b8];
      state[3] = local_2c0 + state[2] + state[3];
      state[2] = state[3] ^ state[2];
      state[3] = state[2] ^ state[3];
      state[2] = state[3] ^ state[2];
      local_2a8 = state[3];
      local_2ac = (uint)state[2] & 0x3f;
      if ((state[2] & 0x3f) != 0) {
        local_2a8 = local_2a8 >> (sbyte)local_2ac | local_2a8 << (0x40U - (sbyte)local_2ac & 0x3f);
      }
      state[3] = local_2a8;
      local_87c = -1;
    }
    local_87c = local_87c + 1;
  }
  local_210 = 0;
  local_214 = 1;
  local_218 = (uint)*state & 0x3ff;
  local_220 = T[(int)local_218];
  state[1] = local_220 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_208 = state[1];
  local_20c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_208 = local_208 >> (sbyte)local_20c | local_208 << (0x40U - (sbyte)local_20c & 0x3f);
  }
  state[1] = local_208;
  local_878 = local_878 << 3;
  local_87c = local_878 & 0x1f;
  for (; (int)local_878 < local_8cc; local_878 = local_878 + 1) {
    local_11 = *(char *)(local_8e0 + (int)local_878) + (char)local_878 + 1;
    local_18 = state8[(int)local_87c] + local_878 + 1 & 7;
    if (local_18 != 0) {
      local_11 = (byte)((int)(uint)local_11 >> (sbyte)local_18) |
                 local_11 << (8U - (sbyte)local_18 & 0x1f);
    }
    state8[(int)local_87c] = state8[(int)local_87c] + local_11;
    local_290 = (int)local_878 % 3;
    local_294 = local_290 + 1;
    local_298 = (uint)state[local_290] & 0x3ff;
    local_2a0 = T[(int)local_298];
    state[local_294] = local_2a0 + state[local_290] + state[local_294];
    state[local_290] = state[local_294] ^ state[local_290];
    state[local_294] = state[local_290] ^ state[local_294];
    state[local_290] = state[local_294] ^ state[local_290];
    local_288 = state[local_294];
    local_28c = (uint)state[local_290] & 0x3f;
    if ((state[local_290] & 0x3f) != 0) {
      local_288 = local_288 >> (sbyte)local_28c | local_288 << (0x40U - (sbyte)local_28c & 0x3f);
    }
    state[local_294] = local_288;
    if (0x1e < (int)local_87c) {
      local_87c = 0xffffffff;
    }
    local_87c = local_87c + 1;
  }
  local_230 = 0;
  local_234 = 1;
  local_238 = (uint)*state & 0x3ff;
  local_240 = T[(int)local_238];
  state[1] = local_240 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_228 = state[1];
  local_22c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_228 = local_228 >> (sbyte)local_22c | local_228 << (0x40U - (sbyte)local_22c & 0x3f);
  }
  state[1] = local_228;
  local_250 = 1;
  local_254 = 2;
  local_258 = (uint)state[1] & 0x3ff;
  local_260 = T[(int)local_258];
  state[2] = local_260 + state[1] + state[2];
  state[1] = state[2] ^ state[1];
  state[2] = state[1] ^ state[2];
  state[1] = state[2] ^ state[1];
  local_248 = state[2];
  local_24c = (uint)state[1] & 0x3f;
  if ((state[1] & 0x3f) != 0) {
    local_248 = local_248 >> (sbyte)local_24c | local_248 << (0x40U - (sbyte)local_24c & 0x3f);
  }
  state[2] = local_248;
  local_270 = 2;
  local_274 = 3;
  local_278 = (uint)state[2] & 0x3ff;
  local_280 = T[(int)local_278];
  state[3] = local_280 + state[2] + state[3];
  state[2] = state[3] ^ state[2];
  state[3] = state[2] ^ state[3];
  state[2] = state[3] ^ state[2];
  local_268 = state[3];
  local_26c = (uint)state[2] & 0x3f;
  if ((state[2] & 0x3f) != 0) {
    local_268 = local_268 >> (sbyte)local_26c | local_268 << (0x40U - (sbyte)local_26c & 0x3f);
  }
  state[3] = local_268;
  local_888 = local_8e8;
  local_890 = local_8e0;
  local_894 = local_8cc;
  local_89c = 0;
  for (local_898 = 0; (int)local_898 < local_8c0; local_898 = local_898 + 1) {
    local_758 = *(long *)(local_8e8 + (long)(int)local_898 * 8) + (long)(int)local_898 + 1;
    local_75c = (int)state[(int)local_89c] + local_898 + 1 & 0x3f;
    if (local_75c != 0) {
      local_758 = local_758 >> (sbyte)local_75c | local_758 << (0x40U - (sbyte)local_75c & 0x3f);
    }
    state[(int)local_89c] = local_758 + state[(int)local_89c];
    if (local_89c == 1) {
      local_1f0 = 0;
      local_1f4 = 1;
      local_1f8 = (uint)*state & 0x3ff;
      local_200 = T[(int)local_1f8];
      state[1] = local_200 + *state + state[1];
      *state = state[1] ^ *state;
      state[1] = *state ^ state[1];
      *state = state[1] ^ *state;
      local_1e8 = state[1];
      local_1ec = (uint)*state & 0x3f;
      if ((*state & 0x3f) != 0) {
        local_1e8 = local_1e8 >> (sbyte)local_1ec | local_1e8 << (0x40U - (sbyte)local_1ec & 0x3f);
      }
      state[1] = local_1e8;
    }
    else if (local_89c == 3) {
      local_1d0 = 2;
      local_1d4 = 3;
      local_1d8 = (uint)state[2] & 0x3ff;
      local_1e0 = T[(int)local_1d8];
      state[3] = local_1e0 + state[2] + state[3];
      state[2] = state[3] ^ state[2];
      state[3] = state[2] ^ state[3];
      state[2] = state[3] ^ state[2];
      local_1c8 = state[3];
      local_1cc = (uint)state[2] & 0x3f;
      if ((state[2] & 0x3f) != 0) {
        local_1c8 = local_1c8 >> (sbyte)local_1cc | local_1c8 << (0x40U - (sbyte)local_1cc & 0x3f);
      }
      state[3] = local_1c8;
      local_89c = -1;
    }
    local_89c = local_89c + 1;
  }
  local_130 = 0;
  local_134 = 1;
  local_138 = (uint)*state & 0x3ff;
  local_140 = T[(int)local_138];
  state[1] = local_140 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_128 = state[1];
  local_12c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_128 = local_128 >> (sbyte)local_12c | local_128 << (0x40U - (sbyte)local_12c & 0x3f);
  }
  state[1] = local_128;
  local_898 = local_898 << 3;
  local_89c = local_898 & 0x1f;
  for (; (int)local_898 < local_8cc; local_898 = local_898 + 1) {
    local_9 = *(char *)(local_8e0 + (int)local_898) + (char)local_898 + 1;
    local_10 = state8[(int)local_89c] + local_898 + 1 & 7;
    if (local_10 != 0) {
      local_9 = (byte)((int)(uint)local_9 >> (sbyte)local_10) |
                local_9 << (8U - (sbyte)local_10 & 0x1f);
    }
    state8[(int)local_89c] = state8[(int)local_89c] + local_9;
    local_1b0 = (int)local_898 % 3;
    local_1b4 = local_1b0 + 1;
    local_1b8 = (uint)state[local_1b0] & 0x3ff;
    local_1c0 = T[(int)local_1b8];
    state[local_1b4] = local_1c0 + state[local_1b0] + state[local_1b4];
    state[local_1b0] = state[local_1b4] ^ state[local_1b0];
    state[local_1b4] = state[local_1b0] ^ state[local_1b4];
    state[local_1b0] = state[local_1b4] ^ state[local_1b0];
    local_1a8 = state[local_1b4];
    local_1ac = (uint)state[local_1b0] & 0x3f;
    if ((state[local_1b0] & 0x3f) != 0) {
      local_1a8 = local_1a8 >> (sbyte)local_1ac | local_1a8 << (0x40U - (sbyte)local_1ac & 0x3f);
    }
    state[local_1b4] = local_1a8;
    if (0x1e < (int)local_89c) {
      local_89c = 0xffffffff;
    }
    local_89c = local_89c + 1;
  }
  local_150 = 0;
  local_154 = 1;
  local_158 = (uint)*state & 0x3ff;
  local_160 = T[(int)local_158];
  state[1] = local_160 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_148 = state[1];
  local_14c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_148 = local_148 >> (sbyte)local_14c | local_148 << (0x40U - (sbyte)local_14c & 0x3f);
  }
  state[1] = local_148;
  local_170 = 1;
  local_174 = 2;
  local_178 = (uint)state[1] & 0x3ff;
  local_180 = T[(int)local_178];
  state[2] = local_180 + state[1] + state[2];
  state[1] = state[2] ^ state[1];
  state[2] = state[1] ^ state[2];
  state[1] = state[2] ^ state[1];
  local_168 = state[2];
  local_16c = (uint)state[1] & 0x3f;
  if ((state[1] & 0x3f) != 0) {
    local_168 = local_168 >> (sbyte)local_16c | local_168 << (0x40U - (sbyte)local_16c & 0x3f);
  }
  state[2] = local_168;
  local_190 = 2;
  local_194 = 3;
  local_198 = (uint)state[2] & 0x3ff;
  local_1a0 = T[(int)local_198];
  state[3] = local_1a0 + state[2] + state[3];
  state[2] = state[3] ^ state[2];
  state[3] = state[2] ^ state[3];
  state[2] = state[3] ^ state[2];
  local_188 = state[3];
  local_18c = (uint)state[2] & 0x3f;
  if ((state[2] & 0x3f) != 0) {
    local_188 = local_188 >> (sbyte)local_18c | local_188 << (0x40U - (sbyte)local_18c & 0x3f);
  }
  state[3] = local_188;
  local_8a8 = local_8e8;
  local_8b0 = local_8e0;
  local_8b4 = local_8cc;
  local_8bc = 0;
  for (local_8b8 = 0; (int)local_8b8 < local_8c0; local_8b8 = local_8b8 + 1) {
    local_748 = *(long *)(local_8e8 + (long)(int)local_8b8 * 8) + (long)(int)local_8b8 + 1;
    local_74c = (int)state[(int)local_8bc] + local_8b8 + 1 & 0x3f;
    if (local_74c != 0) {
      local_748 = local_748 >> (sbyte)local_74c | local_748 << (0x40U - (sbyte)local_74c & 0x3f);
    }
    state[(int)local_8bc] = local_748 + state[(int)local_8bc];
    if (local_8bc == 1) {
      local_110 = 0;
      local_114 = 1;
      local_118 = (uint)*state & 0x3ff;
      local_120 = T[(int)local_118];
      state[1] = local_120 + *state + state[1];
      *state = state[1] ^ *state;
      state[1] = *state ^ state[1];
      *state = state[1] ^ *state;
      local_108 = state[1];
      local_10c = (uint)*state & 0x3f;
      if ((*state & 0x3f) != 0) {
        local_108 = local_108 >> (sbyte)local_10c | local_108 << (0x40U - (sbyte)local_10c & 0x3f);
      }
      state[1] = local_108;
    }
    else if (local_8bc == 3) {
      local_f0 = 2;
      local_f4 = 3;
      local_f8 = (uint)state[2] & 0x3ff;
      local_100 = T[(int)local_f8];
      state[3] = local_100 + state[2] + state[3];
      state[2] = state[3] ^ state[2];
      state[3] = state[2] ^ state[3];
      state[2] = state[3] ^ state[2];
      local_e8 = state[3];
      local_ec = (uint)state[2] & 0x3f;
      if ((state[2] & 0x3f) != 0) {
        local_e8 = local_e8 >> (sbyte)local_ec | local_e8 << (0x40U - (sbyte)local_ec & 0x3f);
      }
      state[3] = local_e8;
      local_8bc = -1;
    }
    local_8bc = local_8bc + 1;
  }
  local_50 = 0;
  local_54 = 1;
  local_58 = (uint)*state & 0x3ff;
  local_60 = T[(int)local_58];
  state[1] = local_60 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_48 = state[1];
  local_4c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_48 = local_48 >> (sbyte)local_4c | local_48 << (0x40U - (sbyte)local_4c & 0x3f);
  }
  state[1] = local_48;
  local_8b8 = local_8b8 << 3;
  local_8bc = local_8b8 & 0x1f;
  for (; (int)local_8b8 < local_8cc; local_8b8 = local_8b8 + 1) {
    local_1 = *(char *)(local_8e0 + (int)local_8b8) + (char)local_8b8 + 1;
    local_8 = state8[(int)local_8bc] + local_8b8 + 1 & 7;
    if (local_8 != 0) {
      local_1 = (byte)((int)(uint)local_1 >> (sbyte)local_8) |
                local_1 << (8U - (sbyte)local_8 & 0x1f);
    }
    state8[(int)local_8bc] = state8[(int)local_8bc] + local_1;
    local_d0 = (int)local_8b8 % 3;
    local_d4 = local_d0 + 1;
    local_d8 = (uint)state[local_d0] & 0x3ff;
    local_e0 = T[(int)local_d8];
    state[local_d4] = local_e0 + state[local_d0] + state[local_d4];
    state[local_d0] = state[local_d4] ^ state[local_d0];
    state[local_d4] = state[local_d0] ^ state[local_d4];
    state[local_d0] = state[local_d4] ^ state[local_d0];
    local_c8 = state[local_d4];
    local_cc = (uint)state[local_d0] & 0x3f;
    if ((state[local_d0] & 0x3f) != 0) {
      local_c8 = local_c8 >> (sbyte)local_cc | local_c8 << (0x40U - (sbyte)local_cc & 0x3f);
    }
    state[local_d4] = local_c8;
    if (0x1e < (int)local_8bc) {
      local_8bc = 0xffffffff;
    }
    local_8bc = local_8bc + 1;
  }
  local_70 = 0;
  local_74 = 1;
  local_78 = (uint)*state & 0x3ff;
  local_80 = T[(int)local_78];
  state[1] = local_80 + *state + state[1];
  *state = state[1] ^ *state;
  state[1] = *state ^ state[1];
  *state = state[1] ^ *state;
  local_68 = state[1];
  local_6c = (uint)*state & 0x3f;
  if ((*state & 0x3f) != 0) {
    local_68 = local_68 >> (sbyte)local_6c | local_68 << (0x40U - (sbyte)local_6c & 0x3f);
  }
  state[1] = local_68;
  local_90 = 1;
  local_94 = 2;
  local_98 = (uint)state[1] & 0x3ff;
  local_a0 = T[(int)local_98];
  state[2] = local_a0 + state[1] + state[2];
  state[1] = state[2] ^ state[1];
  state[2] = state[1] ^ state[2];
  state[1] = state[2] ^ state[1];
  local_88 = state[2];
  local_8c = (uint)state[1] & 0x3f;
  if ((state[1] & 0x3f) != 0) {
    local_88 = local_88 >> (sbyte)local_8c | local_88 << (0x40U - (sbyte)local_8c & 0x3f);
  }
  state[2] = local_88;
  local_b0 = 2;
  local_b4 = 3;
  local_b8 = (uint)state[2] & 0x3ff;
  local_c0 = T[(int)local_b8];
  state[3] = local_c0 + state[2] + state[3];
  state[2] = state[3] ^ state[2];
  state[3] = state[2] ^ state[3];
  state[2] = state[3] ^ state[2];
  local_a8 = state[3];
  local_ac = (uint)state[2] & 0x3f;
  if ((state[2] & 0x3f) != 0) {
    local_a8 = local_a8 >> (sbyte)local_ac | local_a8 << (0x40U - (sbyte)local_ac & 0x3f);
  }
  state[3] = local_a8;
  local_8a0 = local_8c0;
  local_880 = local_8c0;
  local_850 = local_8f8;
  local_848 = local_900;
  local_830 = local_8f8;
  local_828 = local_900;
  local_820 = local_8c0;
  local_800 = local_8c0;
  local_7e0 = local_8c0;
  memset(local_928,0,0x20);
  *local_8d8 = state[3] + state[2];
  return;
}

Assistant:

void beamsplitter_64 ( const void * key, int len, unsigned seed, void * out )
    {
      const uint8_t *key8Arr = (uint8_t *)key;
      const uint64_t *key64Arr = (uint64_t *)key;

      uint8_t seedbuf[8] = {0};
      uint8_t *seed8Arr = (uint8_t *)seedbuf;
      uint64_t *seed64Arr = (uint64_t *)seedbuf;
      uint32_t *seed32Arr = (uint32_t *)seedbuf;

      // the cali number from the Matrix (1999)
      seed32Arr[0] = 0xc5550690;
      seed32Arr[0] -= seed;
      seed32Arr[1] = ~(1 - seed);

      // nothing up my sleeve
      state[0] = 0x123456789abcdef0;
      state[1] = 0x0fedcba987654321;
      state[2] = 0xaccadacca80081e5;
      state[3] = 0xf00baaf00f00baaa;

      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( seed64Arr, seed8Arr, 8 );
      //round( state, state8, STATE   );
      round( seed64Arr, seed8Arr, 8 );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );

      /*
      //printf("state = %#018" PRIx64 " %#018" PRIx64 " %#018" PRIx64 " %#018" PRIx64 "\n",
      //  state[0], state[1], state[2], state[3] );
      */

      //printf("state = %#018" PRIx64 " %#018" PRIx64 "\n",
      //  state[0], state[1] );

      uint8_t output[STATE] = {0};
      uint64_t *h = (uint64_t *)output;

      // The new combination step
      h[0] = state[2];
      h[1] = state[3];

      h[0] += h[1];

      ((uint64_t *)out)[0] = h[0];
    }